

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void __thiscall
google::protobuf::Reflection::SwapElements
          (Reflection *this,Message *message,FieldDescriptor *field,int index1,int index2)

{
  float fVar1;
  double dVar2;
  uint uVar3;
  unsigned_long uVar4;
  void *pvVar5;
  Descriptor *expected;
  byte bVar6;
  bool bVar7;
  uint32_t uVar8;
  CppStringType CVar9;
  RepeatedField<int> *this_00;
  uint *puVar10;
  RepeatedField<unsigned_long> *this_01;
  unsigned_long *puVar11;
  RepeatedField<absl::lts_20250127::Cord> *this_02;
  RepeatedField<long> *this_03;
  RepeatedField<unsigned_int> *this_04;
  RepeatedField<bool> *this_05;
  bool *pbVar12;
  RepeatedField<double> *this_06;
  double *pdVar13;
  RepeatedField<float> *this_07;
  float *pfVar14;
  MapFieldBase *this_08;
  RepeatedPtrFieldBase *this_09;
  void **ppvVar15;
  void **ppvVar16;
  char *description;
  Metadata MVar17;
  
  MVar17 = Message::GetMetadata(message);
  if (MVar17.reflection != this) {
LAB_001ee686:
    expected = this->descriptor_;
    MVar17 = Message::GetMetadata(message);
    anon_unknown_6::ReportReflectionUsageMessageError(expected,MVar17.descriptor,field,"Swap");
  }
  if (field->containing_type_ != this->descriptor_) {
    description = "Field does not match message type.";
LAB_001ee6c5:
    anon_unknown_6::ReportReflectionUsageError(this->descriptor_,field,"Swap",description);
  }
  bVar6 = field->field_0x1;
  if (0xbf < bVar6 != (bool)((bVar6 & 0x20) >> 5)) {
    SwapElements();
    goto LAB_001ee686;
  }
  if ((bVar6 & 0x20) == 0) {
    description = "Field is singular; the method requires a repeated field.";
    goto LAB_001ee6c5;
  }
  if ((bVar6 & 8) != 0) {
    uVar8 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
    internal::ExtensionSet::SwapElements
              ((ExtensionSet *)
               ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar8),field->number_
               ,index1,index2);
    return;
  }
  bVar6 = field->type_;
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)bVar6 * 4)) {
  case 1:
  case 8:
    VerifyFieldType<google::protobuf::RepeatedField<int>>(this,field);
    this_00 = (RepeatedField<int> *)MutableRawImpl(this,message,field);
    puVar10 = (uint *)RepeatedField<int>::elements
                                (this_00,(undefined1  [16])
                                         ((undefined1  [16])(this_00->soo_rep_).field_0 &
                                         (undefined1  [16])0x4) == (undefined1  [16])0x0);
    goto LAB_001ee505;
  case 2:
    VerifyFieldType<google::protobuf::RepeatedField<long>>(this,field);
    this_03 = (RepeatedField<long> *)MutableRawImpl(this,message,field);
    puVar11 = (unsigned_long *)
              RepeatedField<long>::elements
                        (this_03,(undefined1  [16])
                                 ((undefined1  [16])(this_03->soo_rep_).field_0 &
                                 (undefined1  [16])0x4) == (undefined1  [16])0x0);
    goto LAB_001ee4c0;
  case 3:
    VerifyFieldType<google::protobuf::RepeatedField<unsigned_int>>(this,field);
    this_04 = (RepeatedField<unsigned_int> *)MutableRawImpl(this,message,field);
    puVar10 = RepeatedField<unsigned_int>::elements
                        (this_04,(undefined1  [16])
                                 ((undefined1  [16])(this_04->soo_rep_).field_0 &
                                 (undefined1  [16])0x4) == (undefined1  [16])0x0);
LAB_001ee505:
    uVar3 = puVar10[index1];
    puVar10[index1] = puVar10[index2];
    puVar10[index2] = uVar3;
    break;
  case 4:
    VerifyFieldType<google::protobuf::RepeatedField<unsigned_long>>(this,field);
    this_01 = (RepeatedField<unsigned_long> *)MutableRawImpl(this,message,field);
    puVar11 = RepeatedField<unsigned_long>::elements
                        (this_01,(undefined1  [16])
                                 ((undefined1  [16])(this_01->soo_rep_).field_0 &
                                 (undefined1  [16])0x4) == (undefined1  [16])0x0);
LAB_001ee4c0:
    uVar4 = puVar11[index1];
    puVar11[index1] = puVar11[index2];
    puVar11[index2] = uVar4;
    break;
  case 5:
    VerifyFieldType<google::protobuf::RepeatedField<double>>(this,field);
    this_06 = (RepeatedField<double> *)MutableRawImpl(this,message,field);
    pdVar13 = RepeatedField<double>::elements
                        (this_06,(undefined1  [16])
                                 ((undefined1  [16])(this_06->soo_rep_).field_0 &
                                 (undefined1  [16])0x4) == (undefined1  [16])0x0);
    dVar2 = pdVar13[index1];
    pdVar13[index1] = pdVar13[index2];
    pdVar13[index2] = dVar2;
    break;
  case 6:
    VerifyFieldType<google::protobuf::RepeatedField<float>>(this,field);
    this_07 = (RepeatedField<float> *)MutableRawImpl(this,message,field);
    pfVar14 = RepeatedField<float>::elements
                        (this_07,(undefined1  [16])
                                 ((undefined1  [16])(this_07->soo_rep_).field_0 &
                                 (undefined1  [16])0x4) == (undefined1  [16])0x0);
    fVar1 = pfVar14[index1];
    pfVar14[index1] = pfVar14[index2];
    pfVar14[index2] = fVar1;
    break;
  case 7:
    VerifyFieldType<google::protobuf::RepeatedField<bool>>(this,field);
    this_05 = (RepeatedField<bool> *)MutableRawImpl(this,message,field);
    pbVar12 = RepeatedField<bool>::elements
                        (this_05,(undefined1  [16])
                                 ((undefined1  [16])(this_05->soo_rep_).field_0 &
                                 (undefined1  [16])0x4) == (undefined1  [16])0x0);
    bVar7 = pbVar12[index1];
    pbVar12[index1] = pbVar12[index2];
    pbVar12[index2] = bVar7;
    break;
  case 9:
    CVar9 = FieldDescriptor::cpp_string_type(field);
    if (CVar9 == kCord) {
      VerifyFieldType<google::protobuf::RepeatedField<absl::lts_20250127::Cord>>(this,field);
      this_02 = (RepeatedField<absl::lts_20250127::Cord> *)MutableRawImpl(this,message,field);
      RepeatedField<absl::lts_20250127::Cord>::SwapElements(this_02,index1,index2);
      return;
    }
    bVar6 = field->type_;
  case 10:
    if ((bVar6 == 0xb) && (bVar7 = FieldDescriptor::is_map_message_type(field), bVar7)) {
      VerifyFieldType<google::protobuf::internal::MapFieldBase>(this,field);
      this_08 = (MapFieldBase *)MutableRawImpl(this,message,field);
      this_09 = internal::MapFieldBase::MutableRepeatedField(this_08);
    }
    else {
      VerifyFieldType<google::protobuf::internal::RepeatedPtrFieldBase>(this,field);
      this_09 = (RepeatedPtrFieldBase *)MutableRawImpl(this,message,field);
    }
    ppvVar15 = internal::RepeatedPtrFieldBase::element_at(this_09,index1);
    ppvVar16 = internal::RepeatedPtrFieldBase::element_at(this_09,index2);
    pvVar5 = *ppvVar15;
    *ppvVar15 = *ppvVar16;
    *ppvVar16 = pvVar5;
  }
  return;
}

Assistant:

void Reflection::SwapElements(Message* message, const FieldDescriptor* field,
                              int index1, int index2) const {
  USAGE_CHECK_MESSAGE(Swap, message);
  USAGE_CHECK_MESSAGE_TYPE(Swap);
  USAGE_CHECK_REPEATED(Swap);

  if (field->is_extension()) {
    MutableExtensionSet(message)->SwapElements(field->number(), index1, index2);
  } else {
    switch (field->cpp_type()) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)                 \
  case FieldDescriptor::CPPTYPE_##UPPERCASE:              \
    MutableRaw<RepeatedField<LOWERCASE> >(message, field) \
        ->SwapElements(index1, index2);                   \
    break

      HANDLE_TYPE(INT32, int32_t);
      HANDLE_TYPE(INT64, int64_t);
      HANDLE_TYPE(UINT32, uint32_t);
      HANDLE_TYPE(UINT64, uint64_t);
      HANDLE_TYPE(DOUBLE, double);
      HANDLE_TYPE(FLOAT, float);
      HANDLE_TYPE(BOOL, bool);
      HANDLE_TYPE(ENUM, int);
#undef HANDLE_TYPE

      case FieldDescriptor::CPPTYPE_STRING:
        if (field->cpp_string_type() == FieldDescriptor::CppStringType::kCord) {
          MutableRaw<RepeatedField<absl::Cord> >(message, field)
              ->SwapElements(index1, index2);
          break;
        }
        ABSL_FALLTHROUGH_INTENDED;
      case FieldDescriptor::CPPTYPE_MESSAGE:
        if (IsMapFieldInApi(field)) {
          MutableRaw<MapFieldBase>(message, field)
              ->MutableRepeatedField()
              ->SwapElements(index1, index2);
        } else {
          MutableRaw<RepeatedPtrFieldBase>(message, field)
              ->SwapElements(index1, index2);
        }
        break;
    }
  }
}